

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemCommand.cpp
# Opt level: O2

unique_ptr<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>_>
__thiscall
anon_unknown.dwarf_33c8f::ParseDummyTool::createCommand(ParseDummyTool *this,StringRef name)

{
  _func_int **pp_Var1;
  char cVar2;
  Command *this_00;
  size_t in_RCX;
  char *pcVar3;
  char *pcVar4;
  StringRef name_00;
  StringRef name_local;
  StringRef local_58;
  string local_48;
  
  pcVar3 = name.Data;
  name_local.Data = (char *)name.Length;
  name_local.Length = in_RCX;
  cVar2 = (**(code **)(**(long **)(pcVar3 + 0x28) + 0x68))();
  pcVar4 = (char *)name.Length;
  if (cVar2 != '\0') {
    llvm::StringRef::str_abi_cxx11_(&local_48,&name_local);
    printf("command(\'%s\')\n",local_48._M_dataplus._M_p);
    std::__cxx11::string::_M_dispose();
    local_58.Data = *(char **)(pcVar3 + 8);
    local_58.Length = *(size_t *)(pcVar3 + 0x10);
    llvm::StringRef::str_abi_cxx11_(&local_48,&local_58);
    printf("  -- \'tool\': \'%s\')\n",local_48._M_dataplus._M_p);
    std::__cxx11::string::_M_dispose();
    pcVar4 = name_local.Data;
    in_RCX = name_local.Length;
  }
  pp_Var1 = *(_func_int ***)(pcVar3 + 0x28);
  this_00 = (Command *)operator_new(0x68);
  name_00.Length = in_RCX;
  name_00.Data = pcVar4;
  llbuild::buildsystem::Command::Command(this_00,name_00);
  (this_00->super_JobDescriptor)._vptr_JobDescriptor = (_func_int **)&PTR__Command_00201470;
  this_00[1].super_JobDescriptor._vptr_JobDescriptor = pp_Var1;
  (this->super_Tool)._vptr_Tool = (_func_int **)this_00;
  return (__uniq_ptr_data<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>,_true,_true>
          )(__uniq_ptr_data<llbuild::buildsystem::Command,_std::default_delete<llbuild::buildsystem::Command>,_true,_true>
            )this;
}

Assistant:

virtual std::unique_ptr<Command> createCommand(
      StringRef name) override {
    if (delegate.shouldShowOutput()) {
      printf("command('%s')\n", name.str().c_str());
      printf("  -- 'tool': '%s')\n", getName().str().c_str());
    }

    return llvm::make_unique<ParseDummyCommand>(delegate, name);
  }